

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void modstltest(void)

{
  double lambda;
  double *pdStack_4a8;
  int s_window;
  double *remainder;
  double *trend;
  double *seasonal;
  int f;
  int N;
  double x [144];
  
  memcpy(&f,&DAT_0017dfe0,0x480);
  seasonal._4_4_ = 0x90;
  seasonal._0_4_ = 0xc;
  lambda._4_4_ = 0xd;
  trend = (double *)calloc(0x90,8);
  remainder = (double *)calloc((long)seasonal._4_4_,8);
  pdStack_4a8 = (double *)calloc((long)seasonal._4_4_,8);
  modstl((double *)&f,seasonal._4_4_,(int)seasonal,(int *)((long)&lambda + 4),(double *)0x0,trend,
         remainder,pdStack_4a8);
  mdisplay(trend,1,seasonal._4_4_);
  mdisplay(remainder,1,seasonal._4_4_);
  mdisplay(pdStack_4a8,1,seasonal._4_4_);
  free(trend);
  free(remainder);
  free(pdStack_4a8);
  return;
}

Assistant:

void modstltest() {
	double x[144] = {112, 118, 132, 129, 121, 135, 148, 148, 136, 119, 104, 118,
        115, 126, 141, 135, 125, 149, 170, 170, 158, 133, 114, 140,
        145, 150, 178, 163, 172, 178, 199, 199, 184, 162, 146, 166,
        171, 180, 193, 181, 183, 218, 230, 242, 209, 191, 172, 194,
        196, 196, 236, 235, 229, 243, 264, 272, 237, 211, 180, 201,
        204, 188, 235, 227, 234, 264, 302, 293, 259, 229, 203, 229,
        242, 233, 267, 269, 270, 315, 364, 347, 312, 274, 237, 278,
        284, 277, 317, 313, 318, 374, 413, 405, 355, 306, 271, 306,
        315, 301, 356, 348, 355, 422, 465, 467, 404, 347, 305, 336,
        340, 318, 362, 348, 363, 435, 491, 505, 404, 359, 310, 337,
        360, 342, 406, 396, 420, 472, 548, 559, 463, 407, 362, 405,
        417, 391, 419, 461, 472, 535, 622, 606, 508, 461, 390, 432
	};

	int N = 144;
	int f = 12;
	double *seasonal,*trend,*remainder;
	int s_window = 13;
	double lambda;

	seasonal = (double*)calloc(N,sizeof(double));
	trend = (double*)calloc(N,sizeof(double));
	remainder = (double*)calloc(N,sizeof(double));

	//stl(x,N,f,s_window_type,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,seasonal,trend,remainder);

	modstl(x,N,f,&s_window,NULL,seasonal,trend,remainder);

	mdisplay(seasonal,1,N);
	mdisplay(trend,1,N);
	mdisplay(remainder,1,N);
	free(seasonal);
	free(trend);
	free(remainder);
}